

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::clearWorkspace(Compiler *this)

{
  Locked<kj::Own<capnp::compiler::Compiler::Impl>_> local_20;
  
  kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
  local_20.ptr = &(this->impl).value;
  local_20.mutex = &(this->impl).mutex;
  Impl::clearWorkspace((this->impl).value.ptr);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl>_>::~Locked(&local_20);
  return;
}

Assistant:

void Compiler::clearWorkspace() const {
  impl.lockExclusive()->get()->clearWorkspace();
}